

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int evp_keyex_on_exchange
              (ptls_key_exchange_context_t **_ctx,int release,ptls_iovec_t *secret,
              ptls_iovec_t peerkey)

{
  st_evp_keyex_context_t *ctx;
  int iVar1;
  uint uVar2;
  EVP_PKEY *to;
  EVP_PKEY_CTX *ctx_00;
  uchar *key;
  EVP_PKEY_CTX *ctx_01;
  uint uVar3;
  
  ctx = (st_evp_keyex_context_t *)*_ctx;
  if (secret == (ptls_iovec_t *)0x0) {
    uVar3 = 0;
    uVar2 = 1;
  }
  else {
    secret->base = (uint8_t *)0x0;
    secret->len = 0;
    if ((ctx->super).pubkey.len == peerkey.len) {
      to = EVP_PKEY_new();
      uVar3 = 0x201;
      if (to != (EVP_PKEY *)0x0) {
        iVar1 = EVP_PKEY_copy_parameters(to,(EVP_PKEY *)ctx->privkey);
        if ((iVar1 < 1) ||
           (iVar1 = EVP_PKEY_set1_encoded_public_key(to,peerkey.base,peerkey.len), iVar1 < 1)) {
          uVar2 = 0;
          uVar3 = 0x203;
          ctx_01 = (EVP_PKEY_CTX *)0x0;
        }
        else {
          ctx_00 = EVP_PKEY_CTX_new((EVP_PKEY *)ctx->privkey,(ENGINE *)0x0);
          ctx_01 = (EVP_PKEY_CTX *)0x0;
          if ((ctx_00 != (EVP_PKEY_CTX *)0x0) &&
             ((iVar1 = EVP_PKEY_derive_init(ctx_00), ctx_01 = ctx_00, 0 < iVar1 &&
              (iVar1 = EVP_PKEY_derive_set_peer(ctx_00,to), 0 < iVar1)))) {
            iVar1 = EVP_PKEY_derive(ctx_00,(uchar *)0x0,&secret->len);
            if (0 < iVar1) {
              key = (uchar *)malloc(secret->len);
              secret->base = key;
              uVar2 = 0;
              if (key != (uchar *)0x0) {
                iVar1 = EVP_PKEY_derive(ctx_00,key,&secret->len);
                uVar3 = 0x203;
                if (0 < iVar1) {
                  uVar3 = uVar2;
                }
                uVar2 = (uint)(0 < iVar1);
              }
              goto LAB_00127d74;
            }
          }
          uVar2 = 0;
          uVar3 = 0x203;
        }
        goto LAB_00127d74;
      }
    }
    else {
      uVar3 = 0x33;
    }
    uVar2 = 0;
  }
  ctx_01 = (EVP_PKEY_CTX *)0x0;
  to = (EVP_PKEY *)0x0;
LAB_00127d74:
  if (ctx_01 != (EVP_PKEY_CTX *)0x0) {
    EVP_PKEY_CTX_free(ctx_01);
  }
  if (to != (EVP_PKEY *)0x0) {
    EVP_PKEY_free(to);
  }
  if ((char)uVar2 == '\0') {
    free(secret->base);
    secret->base = (uint8_t *)0x0;
    secret->len = 0;
  }
  if (release != 0) {
    evp_keyex_free(ctx);
    *_ctx = (ptls_key_exchange_context_t *)0x0;
  }
  return uVar3;
}

Assistant:

static int evp_keyex_on_exchange(ptls_key_exchange_context_t **_ctx, int release, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    struct st_evp_keyex_context_t *ctx = (void *)*_ctx;
    EVP_PKEY *evppeer = NULL;
    EVP_PKEY_CTX *evpctx = NULL;
    int ret;

    if (secret == NULL) {
        ret = 0;
        goto Exit;
    }

    *secret = ptls_iovec_init(NULL, 0);

    if (peerkey.len != ctx->super.pubkey.len) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }

#ifdef OPENSSL_IS_BORINGSSL
#define X25519_KEY_SIZE 32
    if (ctx->super.algo->id == PTLS_GROUP_X25519) {
        /* allocate memory to return secret */
        if ((secret->base = malloc(X25519_KEY_SIZE)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        secret->len = X25519_KEY_SIZE;
        /* fetch raw key and derive the secret */
        uint8_t sk_raw[X25519_KEY_SIZE];
        size_t sk_raw_len = sizeof(sk_raw);
        if (EVP_PKEY_get_raw_private_key(ctx->privkey, sk_raw, &sk_raw_len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        assert(sk_raw_len == sizeof(sk_raw));
        X25519(secret->base, sk_raw, peerkey.base);
        ptls_clear_memory(sk_raw, sizeof(sk_raw));
        /* check bad key */
        static const uint8_t zeros[X25519_KEY_SIZE] = {0};
        if (ptls_mem_equal(secret->base, zeros, X25519_KEY_SIZE)) {
            ret = PTLS_ERROR_INCOMPATIBLE_KEY;
            goto Exit;
        }
        /* success */
        ret = 0;
        goto Exit;
    }
#undef X25519_KEY_SIZE
#endif

    if ((evppeer = EVP_PKEY_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (EVP_PKEY_copy_parameters(evppeer, ctx->privkey) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_set1_tls_encodedpoint(evppeer, peerkey.base, peerkey.len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((evpctx = EVP_PKEY_CTX_new(ctx->privkey, NULL)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive_init(evpctx) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive_set_peer(evpctx, evppeer) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive(evpctx, NULL, &secret->len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((secret->base = malloc(secret->len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (EVP_PKEY_derive(evpctx, secret->base, &secret->len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    ret = 0;
Exit:
    if (evpctx != NULL)
        EVP_PKEY_CTX_free(evpctx);
    if (evppeer != NULL)
        EVP_PKEY_free(evppeer);
    if (ret != 0) {
        free(secret->base);
        *secret = ptls_iovec_init(NULL, 0);
    }
    if (release) {
        evp_keyex_free(ctx);
        *_ctx = NULL;
    }
    return ret;
}